

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::visualize_accel(PathTracer *this)

{
  double dVar1;
  BVHNode *this_00;
  BVHNode *pBVar2;
  value_type this_01;
  Color c;
  Color c_00;
  Color c_01;
  Color c_02;
  bool bVar3;
  const_reference ppBVar4;
  reference ppPVar5;
  reference ppBVar6;
  double dVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  double *pdVar10;
  int local_1b0 [6];
  Vector3D local_198;
  undefined1 local_180 [8];
  Vector3D end;
  double ray_t;
  size_t i_4;
  BVHNode *current;
  BVHNode *local_100;
  undefined1 local_f8 [8];
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  tstack;
  size_t i_3;
  size_t i_2;
  BVHNode *child_1;
  size_t i_1;
  BVHNode *child;
  size_t i;
  BVHNode *selected;
  Color cprim_hl_edges;
  Color cprim_hl_right;
  Color cprim_hl_left;
  Color cnode_hl_child;
  Color cnode_hl;
  Color cnode;
  PathTracer *this_local;
  
  glPushAttrib(0x2000);
  glDisable(0xb50);
  glBlendFunc(1,0);
  glLineWidth(0x3a83126f);
  glEnable(0xb71);
  Color::Color((Color *)&cnode_hl.b,0.5,0.5,0.5,0.25);
  Color::Color((Color *)&cnode_hl_child.b,1.0,0.25,0.0,0.6);
  Color::Color((Color *)&cprim_hl_left.b,1.0,1.0,1.0,0.6);
  Color::Color((Color *)&cprim_hl_right.b,0.6,0.6,1.0,1.0);
  Color::Color((Color *)&cprim_hl_edges.b,0.8,0.8,1.0,1.0);
  Color::Color((Color *)&selected,0.0,0.0,0.0,0.5);
  ppBVar4 = std::
            stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
            ::top(&this->selectionHistory);
  this_00 = *ppBVar4;
  glPolygonOffset(0x3f800000);
  glEnable(0x8037);
  bVar3 = StaticScene::BVHNode::isLeaf(this_00);
  if (bVar3) {
    for (child = (BVHNode *)0x0; child < (BVHNode *)this_00->range;
        child = (BVHNode *)((long)&(child->bb).max.x + 1)) {
      ppPVar5 = std::
                vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                ::operator[](&(this->bvh->super_Aggregate).primitives,
                             (long)&(child->bb).max.x + this_00->start);
      (*(*ppPVar5)->_vptr_Primitive[4])(*ppPVar5,&cprim_hl_right.b);
    }
  }
  else {
    if (this_00->l != (BVHNode *)0x0) {
      pBVar2 = this_00->l;
      for (child_1 = (BVHNode *)0x0; child_1 < (BVHNode *)pBVar2->range;
          child_1 = (BVHNode *)((long)&(child_1->bb).max.x + 1)) {
        ppPVar5 = std::
                  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                  ::operator[](&(this->bvh->super_Aggregate).primitives,
                               (long)&(child_1->bb).max.x + pBVar2->start);
        (*(*ppPVar5)->_vptr_Primitive[4])(*ppPVar5,&cprim_hl_right.b);
      }
    }
    if (this_00->r != (BVHNode *)0x0) {
      pBVar2 = this_00->r;
      for (i_3 = 0; i_3 < pBVar2->range; i_3 = i_3 + 1) {
        ppPVar5 = std::
                  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                  ::operator[](&(this->bvh->super_Aggregate).primitives,pBVar2->start + i_3);
        (*(*ppPVar5)->_vptr_Primitive[4])(*ppPVar5,&cprim_hl_edges.b);
      }
    }
  }
  glDisable(0x8037);
  for (tstack.c.
       super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      tstack.c.
      super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node < (_Map_pointer)this_00->range;
      tstack.c.
      super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node =
           (_Map_pointer)
           ((long)tstack.c.
                  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node + 1)) {
    ppPVar5 = std::
              vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
              ::operator[](&(this->bvh->super_Aggregate).primitives,
                           this_00->start +
                           (long)tstack.c.
                                 super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
    (*(*ppPVar5)->_vptr_Primitive[5])(*ppPVar5,&selected);
  }
  glDepthMask(0);
  std::
  stack<CMU462::StaticScene::BVHNode*,std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>>
  ::
  stack<std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>,void>
            ((stack<CMU462::StaticScene::BVHNode*,std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>>
              *)local_f8);
  local_100 = StaticScene::BVHAccel::get_root(this->bvh);
  std::
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  ::push((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
          *)local_f8,&local_100);
  while (bVar3 = std::
                 stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
                 ::empty((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
                          *)local_f8), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppBVar6 = std::
              stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
              ::top((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
                     *)local_f8);
    this_01 = *ppBVar6;
    std::
    stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
    ::pop((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
           *)local_f8);
    c_02._8_8_ = cnode._0_8_;
    c_02.r = cnode_hl.b;
    c_02.g = cnode_hl.a;
    BBox::draw(&this_01->bb,c_02);
    if (this_01->l != (BVHNode *)0x0) {
      std::
      stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
      ::push((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
              *)local_f8,&this_01->l);
    }
    if (this_01->r != (BVHNode *)0x0) {
      std::
      stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
      ::push((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
              *)local_f8,&this_01->r);
    }
  }
  if (this_00->l != (BVHNode *)0x0) {
    c_01.b = cnode_hl_child.r;
    c_01.a = cnode_hl_child.g;
    c_01.r = cprim_hl_left.b;
    c_01.g = cprim_hl_left.a;
    BBox::draw(&this_00->l->bb,c_01);
  }
  if (this_00->r != (BVHNode *)0x0) {
    c_00.b = cnode_hl_child.r;
    c_00.a = cnode_hl_child.g;
    c_00.r = cprim_hl_left.b;
    c_00.g = cprim_hl_left.a;
    BBox::draw(&this_00->r->bb,c_00);
  }
  glLineWidth(0x40400000);
  c.b = cnode_hl.r;
  c.a = cnode_hl.g;
  c.r = cnode_hl_child.b;
  c.g = cnode_hl_child.a;
  BBox::draw(&this_00->bb,c);
  if ((this->show_rays & 1U) != 0) {
    glLineWidth(0x3f800000);
    glBegin(1);
    for (ray_t = 0.0;
        dVar7 = (double)std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::size
                                  (&this->rayLog), (ulong)ray_t < (ulong)dVar7;
        ray_t = (double)((long)ray_t + 500)) {
      end.z = 100000.0;
      pvVar8 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                         (&this->rayLog,(size_type)ray_t);
      if (pvVar8->hit_t < 0.0) {
        glColor4f(0x3f800000,0,0,0x3dcccccd);
      }
      else {
        pvVar8 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                           (&this->rayLog,(size_type)ray_t);
        end.z = pvVar8->hit_t;
        glColor4f(0x3f800000,0x3f800000,0,0x3dcccccd);
      }
      pvVar8 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                         (&this->rayLog,(size_type)ray_t);
      pvVar9 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                         (&this->rayLog,(size_type)ray_t);
      CMU462::operator*(&local_198,&end.z,&pvVar9->d);
      Vector3D::operator+((Vector3D *)local_180,&pvVar8->o,&local_198);
      pvVar8 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                         (&this->rayLog,(size_type)ray_t);
      local_1b0[5] = 0;
      pdVar10 = Vector3D::operator[](&pvVar8->o,local_1b0 + 5);
      dVar7 = *pdVar10;
      pvVar8 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                         (&this->rayLog,(size_type)ray_t);
      local_1b0[4] = 1;
      pdVar10 = Vector3D::operator[](&pvVar8->o,local_1b0 + 4);
      dVar1 = *pdVar10;
      pvVar8 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                         (&this->rayLog,(size_type)ray_t);
      local_1b0[3] = 2;
      pdVar10 = Vector3D::operator[](&pvVar8->o,local_1b0 + 3);
      glVertex3f((float)dVar7,(float)dVar1,CONCAT44((int)((ulong)*pdVar10 >> 0x20),(float)*pdVar10))
      ;
      local_1b0[2] = 0;
      pdVar10 = Vector3D::operator[]((Vector3D *)local_180,local_1b0 + 2);
      dVar7 = *pdVar10;
      local_1b0[1] = 1;
      Vector3D::operator[]((Vector3D *)local_180,local_1b0 + 1);
      local_1b0[0] = 2;
      Vector3D::operator[]((Vector3D *)local_180,local_1b0);
      glVertex3f((float)dVar7);
    }
    glEnd();
  }
  glDepthMask(1);
  glPopAttrib();
  std::
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  ::~stack((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
            *)local_f8);
  return;
}

Assistant:

void PathTracer::visualize_accel() const {

    glPushAttrib(GL_ENABLE_BIT);
    glDisable(GL_LIGHTING);
    glBlendFunc(GL_ONE, GL_ZERO);
    glLineWidth(.001);
    glEnable(GL_DEPTH_TEST);

    // hardcoded color settings
    Color cnode = Color(.5, .5, .5, .25);
    Color cnode_hl = Color(1., .25, .0, .6);
    Color cnode_hl_child = Color(1., 1., 1., .6);

    Color cprim_hl_left = Color(.6, .6, 1., 1);
    Color cprim_hl_right = Color(.8, .8, 1., 1);
    Color cprim_hl_edges = Color(0., 0., 0., 0.5);

    BVHNode *selected = selectionHistory.top();

    // render solid geometry (with depth offset)
    glPolygonOffset(1.0, 1.0);
    glEnable(GL_POLYGON_OFFSET_FILL);

    if (selected->isLeaf()) {
      for (size_t i = 0; i < selected->range; ++i) {
        bvh->primitives[selected->start + i]->draw(cprim_hl_left);
      }
    } else {
      if (selected->l) {
        BVHNode* child = selected->l;
        for (size_t i = 0; i < child->range; ++i) {
          bvh->primitives[child->start + i]->draw(cprim_hl_left);
        }
      }
      if (selected->r) {
        BVHNode* child = selected->r;
        for (size_t i = 0; i < child->range; ++i) {
          bvh->primitives[child->start + i]->draw(cprim_hl_right);
        }
      }
    }

    glDisable(GL_POLYGON_OFFSET_FILL);

    // draw geometry outline
    for (size_t i = 0; i < selected->range; ++i) {
      bvh->primitives[selected->start + i]->drawOutline(cprim_hl_edges);
    }

    // keep depth buffer check enabled so that mesh occluded bboxes, but
    // disable depth write so that bboxes don't occlude each other.
    glDepthMask(GL_FALSE);

    // create traversal stack
    stack<BVHNode *> tstack;

    // push initial traversal data
    tstack.push(bvh->get_root());

    // draw all BVH bboxes with non-highlighted color
    while (!tstack.empty()) {

      BVHNode *current = tstack.top();
      tstack.pop();

      current->bb.draw(cnode);
      if (current->l) tstack.push(current->l);
      if (current->r) tstack.push(current->r);
    }

    // draw selected node bbox and primitives
    if (selected->l) selected->l->bb.draw(cnode_hl_child);
    if (selected->r) selected->r->bb.draw(cnode_hl_child);

    glLineWidth(3.f);
    selected->bb.draw(cnode_hl);

    // now perform visualization of the rays
    if (show_rays) {
      glLineWidth(1.f);
      glBegin(GL_LINES);

      for (size_t i=0; i<rayLog.size(); i+=500) {

        const static double VERY_LONG = 10e4;
        double ray_t = VERY_LONG;

        // color rays that are hits yellow
        // and rays this miss all geometry red
        if (rayLog[i].hit_t >= 0.0) {
          ray_t = rayLog[i].hit_t;
          glColor4f(1.f, 1.f, 0.f, 0.1f);
        } else {
          glColor4f(1.f, 0.f, 0.f, 0.1f);
        }

        Vector3D end = rayLog[i].o + ray_t * rayLog[i].d;

        glVertex3f(rayLog[i].o[0], rayLog[i].o[1], rayLog[i].o[2]);
        glVertex3f(end[0], end[1], end[2]);
      }
      glEnd();
    }

    glDepthMask(GL_TRUE);
    glPopAttrib();
  }